

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O2

int bmcg_sat_solver_quantify
              (bmcg_sat_solver **pSats,Gia_Man_t *p,int iLit,int fHash,
              _func_int_void_ptr_int *pFuncCiToKeep,void *pData,Vec_Int_t *vDLits)

{
  Vec_Int_t *p_00;
  bmcg_sat_solver **ppbVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *vCiVars;
  Gia_Obj_t *pObj;
  int Fill;
  int i;
  Vec_Str_t *local_78;
  Vec_Int_t *local_70;
  int Lit;
  bmcg_sat_solver **local_48;
  _func_int_void_ptr_int *local_40;
  void *local_38;
  
  local_48 = pSats;
  local_40 = pFuncCiToKeep;
  local_38 = pData;
  p_01 = Vec_IntAlloc(100);
  vCiVars = Vec_IntAlloc(100);
  if (vDLits != (Vec_Int_t *)0x0) {
    vDLits->nSize = 0;
  }
  if (1 < iLit) {
    p_00 = &p->vCopies;
    if ((p->vCopies).nSize < p->nObjs) {
      Vec_IntFillExtra(p_00,p->nObjs,Fill);
    }
    iVar2 = p_01->nSize;
    Vec_IntPush(p_01,0);
    Vec_IntWriteEntry(p_00,0,iVar2);
    if (iVar2 != 0) {
      __assert_fail("iVar == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                    ,0x448,
                    "int bmcg_sat_solver_quantify(bmcg_sat_solver **, Gia_Man_t *, int, int, int (*)(void *, int), void *, Vec_Int_t *)"
                   );
    }
    iVar2 = Abc_Lit2Var(iLit);
    iVar3 = Gia_ManSatAndCollect_rec(p,iVar2,p_01,vCiVars);
    ppbVar1 = local_48;
    Gia_ManQuantLoadCnf(p,p_01,local_48);
    uVar4 = Abc_LitIsCompl(iLit);
    Lit = Abc_Var2Lit(iVar3,uVar4 ^ 1);
    iVar5 = glucose_solver_addclause((SimpSolver *)*ppbVar1,&Lit,1);
    i = 0;
    iVar2 = 1;
    if (iVar5 == 0) {
      local_70 = (Vec_Int_t *)0x0;
      local_78 = (Vec_Str_t *)0x0;
    }
    else {
      local_70 = (Vec_Int_t *)0x0;
      iVar5 = glucose_solver_solve((SimpSolver *)*ppbVar1,(int *)0x0,0);
      local_78 = (Vec_Str_t *)0x0;
      if (iVar5 != -1) {
        iVar2 = Abc_LitIsCompl(iLit);
        Lit = Abc_Var2Lit(iVar3,iVar2);
        iVar2 = glucose_solver_addclause((SimpSolver *)ppbVar1[1],&Lit,1);
        if (iVar2 == 0) {
          local_78 = (Vec_Str_t *)0x0;
          iVar2 = 0;
        }
        else {
          local_70 = (Vec_Int_t *)0x0;
          iVar3 = glucose_solver_solve((SimpSolver *)ppbVar1[1],(int *)0x0,0);
          local_78 = (Vec_Str_t *)0x0;
          iVar2 = 0;
          if (iVar3 != -1) {
            local_70 = Vec_IntStartFull(p_01->nSize);
            iVar2 = 0;
            for (iVar3 = 0; iVar3 < vCiVars->nSize; iVar3 = iVar3 + 1) {
              iVar5 = Vec_IntEntry(vCiVars,iVar3);
              iVar6 = Vec_IntEntry(p_01,iVar5);
              pObj = Gia_ManObj(p,iVar6);
              if ((~*(uint *)pObj & 0x9fffffff) != 0) {
                __assert_fail("Gia_ObjIsCi(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/AbcGlucose.cpp"
                              ,0x476,
                              "int bmcg_sat_solver_quantify(bmcg_sat_solver **, Gia_Man_t *, int, int, int (*)(void *, int), void *, Vec_Int_t *)"
                             );
              }
              iVar6 = Gia_ObjCioId(pObj);
              iVar6 = (*local_40)(local_38,iVar6);
              if (iVar6 != 0) {
                Vec_IntWriteEntry(local_70,iVar5,iVar3);
                iVar2 = iVar2 + 1;
              }
            }
            if (iVar2 == 0) {
              local_78 = (Vec_Str_t *)0x0;
              iVar2 = 1;
            }
            else {
              iVar3 = 0;
              if (iVar2 == vCiVars->nSize) {
                local_78 = (Vec_Str_t *)0x0;
                iVar2 = iLit;
              }
              else {
                local_78 = Glucose_GenerateCubes(local_48,vCiVars,local_70,0);
                for (; iVar3 < vCiVars->nSize; iVar3 = iVar3 + 1) {
                  iVar2 = Vec_IntEntry(vCiVars,iVar3);
                  iVar2 = Vec_IntEntry(p_01,iVar2);
                  Vec_IntWriteEntry(vCiVars,iVar3,iVar2);
                }
                if (vDLits != (Vec_Int_t *)0x0) {
                  bmcg_sat_generate_dvars(vCiVars,local_78,vDLits);
                }
                iVar2 = Gia_ManFactorSop(p,vCiVars,local_78,fHash);
              }
            }
          }
        }
      }
    }
    for (; iLit = iVar2, i < p_01->nSize; i = i + 1) {
      iVar2 = Vec_IntEntry(p_01,i);
      Vec_IntWriteEntry(p_00,iVar2,-1);
      iVar2 = iLit;
    }
    Vec_IntFree(p_01);
    Vec_IntFree(vCiVars);
    if (local_70 != (Vec_Int_t *)0x0) {
      free(local_70->pArray);
      free(local_70);
    }
    if (local_78 != (Vec_Str_t *)0x0) {
      free(local_78->pArray);
      free(local_78);
    }
  }
  return iLit;
}

Assistant:

int bmcg_sat_solver_quantify( bmcg_sat_solver * pSats[], Gia_Man_t * p, int iLit, int fHash, int(*pFuncCiToKeep)(void *, int), void * pData, Vec_Int_t * vDLits )
{
    Vec_Int_t * vObjsUsed = Vec_IntAlloc( 100 ); // GIA objs
    Vec_Int_t * vCiVars = Vec_IntAlloc( 100 );   // CI SAT vars
    Vec_Int_t * vVarMap = NULL; Vec_Str_t * vSop = NULL; 
    int i, iVar, iVarLast, Lit, RetValue, Count = 0, Result = -1;
    if ( vDLits ) Vec_IntClear( vDLits );
    if ( iLit < 2 )
        return iLit;
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    // assign variable number 0 to const0 node
    iVar = Vec_IntSize(vObjsUsed); 
    Vec_IntPush( vObjsUsed, 0 );
    Gia_ObjSetCopyArray( p, 0, iVar );
    assert( iVar == 0 );    

    // collect other variables
    iVarLast = Gia_ManSatAndCollect_rec( p, Abc_Lit2Var(iLit), vObjsUsed, vCiVars );
    Gia_ManQuantLoadCnf( p, vObjsUsed, pSats );

    // check constants
    Lit = Abc_Var2Lit( iVarLast, !Abc_LitIsCompl(iLit) ); 
    RetValue = bmcg_sat_solver_addclause( pSats[0], &Lit, 1 ); // offset
    if ( !RetValue || bmcg_sat_solver_solve(pSats[0], NULL, 0) == GLUCOSE_UNSAT )
    {
        Result = 1;
        goto cleanup;
    }
    Lit = Abc_Var2Lit( iVarLast, Abc_LitIsCompl(iLit) );
    RetValue = bmcg_sat_solver_addclause( pSats[1], &Lit, 1 ); // onset
    if ( !RetValue || bmcg_sat_solver_solve(pSats[1], NULL, 0) == GLUCOSE_UNSAT )
    {
        Result = 0;
        goto cleanup;
    }
/*
    // reorder CI SAT variables to have keep-vars first
    Vec_Int_t * vCiVars2 = Vec_IntAlloc( 100 );   // CI SAT vars
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntPush( vCiVars2, iVar );
    }
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( !pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntPush( vCiVars2, iVar );
    }
    ABC_SWAP( Vec_Int_t *, vCiVars2, vCiVars );
    Vec_IntFree( vCiVars2 );
*/
    // map CI SAT variables into their indexes used in the cubes
    vVarMap = Vec_IntStartFull( Vec_IntSize(vObjsUsed) );
    Vec_IntForEachEntry( vCiVars, iVar, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, Vec_IntEntry(vObjsUsed, iVar) );
        assert( Gia_ObjIsCi(pObj) );
        if ( pFuncCiToKeep(pData, Gia_ObjCioId(pObj)) )
            Vec_IntWriteEntry( vVarMap, iVar, i ), Count++;
    }
    if ( Count == 0 || Count == Vec_IntSize(vCiVars) )
    {
        Result = Count == 0 ? 1 : iLit;
        goto cleanup;
    }
    // generate cubes
    vSop = Glucose_GenerateCubes( pSats, vCiVars, vVarMap, 0 );
    //printf( "%s", Vec_StrArray(vSop) );
    // convert into object IDs
    Vec_IntForEachEntry( vCiVars, iVar, i )
        Vec_IntWriteEntry( vCiVars, i, Vec_IntEntry(vObjsUsed, iVar) );
    // generate unate variables
    if ( vDLits )
        bmcg_sat_generate_dvars( vCiVars, vSop, vDLits );
    // convert into an AIG
    RetValue = Gia_ManAndNum(p);
    Result = Gia_ManFactorSop( p, vCiVars, vSop, fHash );

    // report the result
//    printf( "Performed quantification with %5d nodes, %3d keep-vars, %3d quant-vars, resulting in %5d cubes and %5d nodes. ", 
//        Vec_IntSize(vObjsUsed), Count, Vec_IntSize(vCiVars) - Count, Vec_StrCountEntry(vSop, '\n'), Gia_ManAndNum(p)-RetValue );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clkAll );

cleanup:
    Vec_IntForEachEntry( vObjsUsed, iVar, i )
        Gia_ObjSetCopyArray( p, iVar, -1 );
    Vec_IntFree( vObjsUsed );
    Vec_IntFree( vCiVars );
    Vec_IntFreeP( &vVarMap );
    Vec_StrFreeP( &vSop );
    return Result;
}